

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

void strpool_init(strpool_t *pool,strpool_config_t *config)

{
  uint uVar1;
  int iVar2;
  strpool_internal_hash_slot_t *psVar3;
  strpool_internal_entry_t *psVar4;
  strpool_internal_handle_t *psVar5;
  strpool_internal_block_t *psVar6;
  int local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  strpool_config_t *local_18;
  strpool_config_t *config_local;
  strpool_t *pool_local;
  
  local_18 = config;
  if (config == (strpool_config_t *)0x0) {
    local_18 = &strpool_default_config;
  }
  pool->memctx = local_18->memctx;
  pool->ignore_case = local_18->ignore_case;
  if (0x40 < local_18->counter_bits + local_18->index_bits) {
    __assert_fail("config->counter_bits + config->index_bits <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x22b,"void strpool_init(strpool_t *, const strpool_config_t *)");
  }
  pool->counter_shift = local_18->index_bits;
  pool->counter_mask = (1L << ((byte)local_18->counter_bits & 0x3f)) - 1;
  pool->index_mask = (1L << ((byte)local_18->index_bits & 0x3f)) - 1;
  if (local_18->entry_capacity < 2) {
    local_1c = 2;
  }
  else {
    local_1c = local_18->entry_capacity;
  }
  uVar1 = strpool_internal_pow2ceil(local_1c);
  pool->initial_entry_capacity = uVar1;
  if (local_18->block_capacity < 2) {
    local_20 = 2;
  }
  else {
    local_20 = local_18->block_capacity;
  }
  uVar1 = strpool_internal_pow2ceil(local_20);
  pool->initial_block_capacity = uVar1;
  if (local_18->block_size < 0x101) {
    local_24 = 0x100;
  }
  else {
    local_24 = local_18->block_size;
  }
  uVar1 = strpool_internal_pow2ceil(local_24);
  pool->block_size = uVar1;
  if (local_18->min_length < 9) {
    local_28 = 8;
  }
  else {
    local_28 = local_18->min_length;
  }
  pool->min_data_size = local_28 + 9;
  pool->hash_capacity = pool->initial_entry_capacity << 1;
  pool->entry_capacity = pool->initial_entry_capacity;
  pool->handle_capacity = pool->initial_entry_capacity;
  pool->block_capacity = pool->initial_block_capacity;
  pool->handle_freelist_head = -1;
  pool->handle_freelist_tail = -1;
  pool->block_count = 0;
  pool->handle_count = 0;
  pool->entry_count = 0;
  psVar3 = (strpool_internal_hash_slot_t *)
           sx__malloc((sx_alloc *)pool->memctx,(long)pool->hash_capacity * 0xc,0,(char *)0x0,
                      (char *)0x0,0);
  pool->hash_table = psVar3;
  if (pool->hash_table != (strpool_internal_hash_slot_t *)0x0) {
    memset(pool->hash_table,0,(long)pool->hash_capacity * 0xc);
    psVar4 = (strpool_internal_entry_t *)
             sx__malloc((sx_alloc *)pool->memctx,(long)pool->entry_capacity << 5,0,(char *)0x0,
                        (char *)0x0,0);
    pool->entries = psVar4;
    if (pool->entries == (strpool_internal_entry_t *)0x0) {
      __assert_fail("pool->entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x24a,"void strpool_init(strpool_t *, const strpool_config_t *)");
    }
    psVar5 = (strpool_internal_handle_t *)
             sx__malloc((sx_alloc *)pool->memctx,(long)pool->handle_capacity << 3,0,(char *)0x0,
                        (char *)0x0,0);
    pool->handles = psVar5;
    if (pool->handles != (strpool_internal_handle_t *)0x0) {
      psVar6 = (strpool_internal_block_t *)
               sx__malloc((sx_alloc *)pool->memctx,(long)pool->block_capacity << 5,0,(char *)0x0,
                          (char *)0x0,0);
      pool->blocks = psVar6;
      if (pool->blocks != (strpool_internal_block_t *)0x0) {
        iVar2 = strpool_internal_add_block(pool,pool->block_size);
        pool->current_block = iVar2;
        return;
      }
      __assert_fail("pool->blocks",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x250,"void strpool_init(strpool_t *, const strpool_config_t *)");
    }
    __assert_fail("pool->handles",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x24d,"void strpool_init(strpool_t *, const strpool_config_t *)");
  }
  __assert_fail("pool->hash_table",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x246,"void strpool_init(strpool_t *, const strpool_config_t *)");
}

Assistant:

void strpool_init( strpool_t* pool, strpool_config_t const* config )
    {
    if( !config ) config = &strpool_default_config;

    pool->memctx = config->memctx;
    pool->ignore_case = config->ignore_case;

    STRPOOL_ASSERT( config->counter_bits + config->index_bits <= 64 );
    pool->counter_shift = config->index_bits;
    pool->counter_mask = ( 1ULL << (STRPOOL_U64) config->counter_bits ) - 1;
    pool->index_mask = ( 1ULL << (STRPOOL_U64) config->index_bits ) - 1;

    pool->initial_entry_capacity = 
        (int) strpool_internal_pow2ceil( config->entry_capacity > 1 ? (STRPOOL_U32)config->entry_capacity : 2U );
    pool->initial_block_capacity = 
        (int) strpool_internal_pow2ceil( config->block_capacity > 1 ? (STRPOOL_U32)config->block_capacity : 2U );
    pool->block_size = 
        (int) strpool_internal_pow2ceil( config->block_size > 256 ? (STRPOOL_U32)config->block_size : 256U );
    pool->min_data_size = 
        (int) ( sizeof( int ) * 2 + 1 + ( config->min_length > 8 ? (STRPOOL_U32)config->min_length : 8U ) );

    pool->hash_capacity = pool->initial_entry_capacity * 2;
    pool->entry_capacity = pool->initial_entry_capacity;
    pool->handle_capacity = pool->initial_entry_capacity;
    pool->block_capacity = pool->initial_block_capacity;    

    pool->handle_freelist_head = -1;
    pool->handle_freelist_tail = -1;
    pool->block_count = 0;
    pool->handle_count = 0;
    pool->entry_count = 0;
    
    pool->hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->hash_capacity * sizeof( *pool->hash_table ) );
    STRPOOL_ASSERT( pool->hash_table );
    STRPOOL_MEMSET( pool->hash_table, 0, pool->hash_capacity * sizeof( *pool->hash_table ) );
    pool->entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->entry_capacity * sizeof( *pool->entries ) );
    STRPOOL_ASSERT( pool->entries );
    pool->handles = (strpool_internal_handle_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->handle_capacity * sizeof( *pool->handles ) );
    STRPOOL_ASSERT( pool->handles );
    pool->blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->block_capacity * sizeof( *pool->blocks ) );
    STRPOOL_ASSERT( pool->blocks );

    pool->current_block = strpool_internal_add_block( pool, pool->block_size );
    }